

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_&)>
::Dynamic_Proxy_Function_Impl
          (Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_&)>
           *this,_func_Boxed_Value_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_ptr
                 *t_f,int t_arity,AST_NodePtr *t_parsenode,Param_Types *t_param_types,
          string *t_description,Proxy_Function *t_guard)

{
  Param_Types *in_RCX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Param_Types *in_R8;
  string *in_R9;
  string *this_00;
  string *t_description_00;
  Param_Types *in_stack_ffffffffffffff48;
  AST_NodePtr *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  Dynamic_Proxy_Function *in_stack_ffffffffffffff60;
  string local_98 [136];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::shared_ptr<chaiscript::AST_Node>::shared_ptr
            ((shared_ptr<chaiscript::AST_Node> *)in_R8,(shared_ptr<chaiscript::AST_Node> *)in_RCX);
  Param_Types::Param_Types(in_R8,in_RCX);
  this_00 = local_98;
  std::__cxx11::string::string(this_00,in_R9);
  t_description_00 = (string *)&stack0xffffffffffffff58;
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_R8,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_RCX);
  Dynamic_Proxy_Function::Dynamic_Proxy_Function
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,t_description_00,(Proxy_Function *)this_00);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3b3a7f);
  std::__cxx11::string::~string(local_98);
  Param_Types::~Param_Types((Param_Types *)0x3b3a96);
  std::shared_ptr<chaiscript::AST_Node>::~shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x3b3aa3);
  *in_RDI = &PTR__Dynamic_Proxy_Function_Impl_005c8dc0;
  in_RDI[0x14] = local_10;
  return;
}

Assistant:

Dynamic_Proxy_Function_Impl(
            Callable t_f, 
            int t_arity=-1,
            AST_NodePtr t_parsenode = AST_NodePtr(),
            Param_Types t_param_types = Param_Types(),
            std::string t_description = "",
            Proxy_Function t_guard = Proxy_Function())
          : Dynamic_Proxy_Function(
                t_arity,
                std::move(t_parsenode),
                std::move(t_param_types),
                std::move(t_description),
                std::move(t_guard)
              ),
            m_f(std::move(t_f))
        {
        }